

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O2

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,BlockHash *object)

{
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_005b4050;
  ByteData::ByteData(&this->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->data_).data_,&(object->data_).data_);
  return;
}

Assistant:

BlockHash::BlockHash(const BlockHash& object) { data_ = object.data_; }